

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

run_container_t * run_container_from_array(array_container_t *c)

{
  ushort uVar1;
  int iVar2;
  int32_t size;
  run_container_t *rc;
  int local_38;
  uint16_t cur_val;
  int i;
  int32_t card;
  int run_start;
  int prev;
  run_container_t *answer;
  int32_t n_runs;
  array_container_t *c_local;
  
  size = array_container_number_of_runs(c);
  rc = run_container_create_given_capacity(size);
  card = -2;
  i = -1;
  iVar2 = c->cardinality;
  if (iVar2 != 0) {
    for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
      uVar1 = c->array[local_38];
      if ((uint)uVar1 != card + 1U) {
        if (i != -1) {
          add_run(rc,i,card);
        }
        i = (int)uVar1;
      }
      card = (int32_t)c->array[local_38];
    }
    add_run(rc,i,card);
  }
  return rc;
}

Assistant:

run_container_t *run_container_from_array(const array_container_t *c) {
    int32_t n_runs = array_container_number_of_runs(c);
    run_container_t *answer = run_container_create_given_capacity(n_runs);
    int prev = -2;
    int run_start = -1;
    int32_t card = c->cardinality;
    if (card == 0) return answer;
    for (int i = 0; i < card; ++i) {
        const uint16_t cur_val = c->array[i];
        if (cur_val != prev + 1) {
            // new run starts; flush old one, if any
            if (run_start != -1) add_run(answer, run_start, prev);
            run_start = cur_val;
        }
        prev = c->array[i];
    }
    // now prev is the last seen value
    add_run(answer, run_start, prev);
    // assert(run_container_cardinality(answer) == c->cardinality);
    return answer;
}